

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_crypto.c
# Opt level: O0

_Bool i2p_dest_verify(i2p_dest *dest,uint8_t *buf,size_t sz,uint8_t *sig)

{
  long in_RDI;
  uint8_t *in_stack_00000030;
  uint8_t *in_stack_00000210;
  size_t in_stack_00000218;
  uint8_t *in_stack_00000220;
  uint8_t *in_stack_00000228;
  undefined1 local_1;
  
  if (*(short *)(in_RDI + 0x208) == 0) {
    local_1 = i2p_dsa_verify(in_stack_00000030,dest->buf,(size_t)buf,(uint8_t *)sz);
  }
  else if (*(short *)(in_RDI + 0x208) == 7) {
    local_1 = i2p_eddsa_verify(in_stack_00000228,in_stack_00000220,in_stack_00000218,
                               in_stack_00000210);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool i2p_dest_verify(struct i2p_dest * dest, const uint8_t * buf, size_t sz, const uint8_t * sig)
{
  switch(dest->sigtype)
  {
  case EDDSA_KEYTYPE:
    return i2p_eddsa_verify(dest->sigkey, buf, sz, sig);
  case DSA_KEYTYPE:
    return i2p_dsa_verify(dest->sigkey, buf, sz, sig);
  default:
    return false;
  }
}